

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O3

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,int _defaultValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
  local_60;
  Type local_34;
  
  paVar1 = &local_60.first.field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  local_60.first._M_dataplus._M_p = (pointer)paVar1;
  local_34 = _defaultValue;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + _name->_M_string_length);
  local_60.second = INT;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Type>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
              *)&this->type_dict,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  pcVar2 = (_name->_M_dataplus)._M_p;
  local_60.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + _name->_M_string_length);
  local_60.second = local_34;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)&this->int_dict,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, int _defaultValue)
{
    type_dict.insert(std::make_pair(_name, INT));
    int_dict.insert(std::make_pair(_name, _defaultValue));
}